

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

int ecdh_hash_function_custom(uchar *output,uchar *x,uchar *y,void *data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  *output = '\x04';
  uVar1 = *(undefined8 *)(x + 8);
  uVar2 = *(undefined8 *)(x + 0x10);
  uVar3 = *(undefined8 *)(x + 0x18);
  *(undefined8 *)(output + 1) = *(undefined8 *)x;
  *(undefined8 *)(output + 9) = uVar1;
  *(undefined8 *)(output + 0x11) = uVar2;
  *(undefined8 *)(output + 0x19) = uVar3;
  uVar1 = *(undefined8 *)(y + 8);
  uVar2 = *(undefined8 *)(y + 0x10);
  uVar3 = *(undefined8 *)(y + 0x18);
  *(undefined8 *)(output + 0x21) = *(undefined8 *)y;
  *(undefined8 *)(output + 0x29) = uVar1;
  *(undefined8 *)(output + 0x31) = uVar2;
  *(undefined8 *)(output + 0x39) = uVar3;
  return 1;
}

Assistant:

static int ecdh_hash_function_custom(unsigned char *output, const unsigned char *x, const unsigned char *y, void *data) {
    (void)data;
    /* Save x and y as uncompressed public key */
    output[0] = 0x04;
    memcpy(output + 1, x, 32);
    memcpy(output + 33, y, 32);
    return 1;
}